

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetNextItemOpen(bool is_open,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  ImGuiCond local_1c;
  ImGuiContext *g;
  ImGuiCond cond_local;
  bool is_open_local;
  
  pIVar1 = GImGui;
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 2;
    (pIVar1->NextItemData).OpenVal = is_open;
    local_1c = cond;
    if (cond == 0) {
      local_1c = 1;
    }
    (pIVar1->NextItemData).OpenCond = local_1c;
  }
  return;
}

Assistant:

void ImGui::SetNextItemOpen(bool is_open, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow->SkipItems)
        return;
    g.NextItemData.Flags |= ImGuiNextItemDataFlags_HasOpen;
    g.NextItemData.OpenVal = is_open;
    g.NextItemData.OpenCond = cond ? cond : ImGuiCond_Always;
}